

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

void increase_comb_counter_in_groups
               (size_t *ix_arr,size_t st,size_t end,size_t split_ix,size_t n,double *counter,
               double *weights,double exp_remainder)

{
  ulong *puVar1;
  double dVar2;
  size_t sVar3;
  ulong *puVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  
  puVar1 = ix_arr + st;
  puVar4 = puVar1;
  uVar5 = (long)((long)ix_arr + (end * 8 - (long)puVar1) + 8) >> 3;
  while (0 < (long)uVar5) {
    uVar6 = uVar5 >> 1;
    uVar8 = ~uVar6 + uVar5;
    uVar5 = uVar6;
    if (puVar4[uVar6] < split_ix) {
      puVar4 = puVar4 + uVar6 + 1;
      uVar5 = uVar8;
    }
  }
  uVar5 = ((long)puVar4 - (long)puVar1 >> 3) + st;
  if (exp_remainder <= 1.0) {
    if (st < uVar5) {
      do {
        if (uVar5 <= end) {
          dVar2 = weights[ix_arr[st]];
          lVar7 = ix_arr[st] * (n - split_ix) - split_ix;
          uVar6 = uVar5;
          do {
            sVar3 = ix_arr[uVar6];
            counter[lVar7 + sVar3] = weights[sVar3] * dVar2 + counter[lVar7 + sVar3];
            uVar6 = uVar6 + 1;
          } while (uVar6 <= end);
        }
        st = st + 1;
      } while (st != uVar5);
    }
  }
  else if (st < uVar5) {
    do {
      if (uVar5 <= end) {
        dVar2 = weights[ix_arr[st]];
        lVar7 = ix_arr[st] * (n - split_ix) - split_ix;
        uVar6 = uVar5;
        do {
          sVar3 = ix_arr[uVar6];
          counter[lVar7 + sVar3] = weights[sVar3] * dVar2 * exp_remainder + counter[lVar7 + sVar3];
          uVar6 = uVar6 + 1;
        } while (uVar6 <= end);
      }
      st = st + 1;
    } while (st != uVar5);
  }
  return;
}

Assistant:

void increase_comb_counter_in_groups(size_t ix_arr[], size_t st, size_t end, size_t split_ix, size_t n,
                                     double *restrict counter, double *restrict weights, double exp_remainder)
{
    size_t *ptr_split_ix = std::lower_bound(ix_arr + st, ix_arr + end + 1, split_ix);
    size_t n_group = std::distance(ix_arr + st, ptr_split_ix);
    n = n - split_ix;

    if (exp_remainder <= 1)
        for (size_t ix1 = st; ix1 < st + n_group; ix1++)
            for (size_t ix2 = st + n_group; ix2 <= end; ix2++)
                counter[ix_arr[ix1] * n + ix_arr[ix2] - split_ix]
                    +=
                weights[ix_arr[ix1]] * weights[ix_arr[ix2]];
    else
        for (size_t ix1 = st; ix1 < st + n_group; ix1++)
            for (size_t ix2 = st + n_group; ix2 <= end; ix2++)
                counter[ix_arr[ix1] * n + ix_arr[ix2] - split_ix]
                    +=
                weights[ix_arr[ix1]] * weights[ix_arr[ix2]] * exp_remainder;
}